

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadExternalKind
          (BinaryReader *this,ExternalKind *out_value,char *desc)

{
  bool bVar1;
  Result result;
  byte local_29;
  char *pcStack_28;
  uint8_t value;
  char *desc_local;
  ExternalKind *out_value_local;
  BinaryReader *this_local;
  
  local_29 = 0;
  pcStack_28 = desc;
  desc_local = (char *)out_value;
  out_value_local = (ExternalKind *)this;
  result = ReadU8(this,&local_29,desc);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_29 < 5) {
    *(uint *)desc_local = (uint)local_29;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"invalid export external kind: %d",(ulong)local_29);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadExternalKind(ExternalKind* out_value,
                                      const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));
  ERROR_UNLESS(value < kExternalKindCount, "invalid export external kind: %d",
               value);
  *out_value = static_cast<ExternalKind>(value);
  return Result::Ok;
}